

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.h
# Opt level: O2

void __thiscall xemmai::portable::t_library::t_library(t_library *this,wstring *a_path)

{
  void *pvVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  undefined8 local_38;
  wstring_view in_stack_ffffffffffffffd0;
  
  std::operator+(&local_58,a_path,L".so");
  f_convert_abi_cxx11_(in_stack_ffffffffffffffd0);
  pvVar1 = (void *)dlopen(local_38,0x101);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  this->v_handle = pvVar1;
  return;
}

Assistant:

t_library(const std::wstring& a_path) : v_handle(dlopen(f_convert(a_path + L".so").c_str(), RTLD_LAZY | RTLD_GLOBAL))
	{
//		if (v_handle == NULL) std::fprintf(stderr, "dlopen: %s\n", dlerror());
	}